

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteDbRelease(unqlite *pDb)

{
  int iVar1;
  unqlite_vm *puVar2;
  jx9 *pEngine;
  jx9 *pjVar3;
  unqlite_file *pChunk;
  SyMemBackend *pBackend;
  int iVar4;
  Pager *pPVar5;
  unqlite_vm *puVar6;
  
  pPVar5 = (pDb->sDB).pPager;
  if ((pDb->iFlags & 1) == 0) {
    iVar4 = unqlitePagerCommit(pPVar5);
    if (iVar4 == 0) {
      iVar4 = 0;
      goto LAB_0010b9ec;
    }
    pPVar5 = (pDb->sDB).pPager;
  }
  iVar4 = unqlitePagerRollback(pPVar5,0);
LAB_0010b9ec:
  pPVar5 = (pDb->sDB).pPager;
  pager_release_kv_engine(pPVar5);
  if (((pPVar5->iOpenFlags & 0x100) != 0) && (pPVar5->pMmap != (void *)0x0)) {
    munmap(pPVar5->pMmap,pPVar5->dbByteSize);
  }
  if ((pPVar5->is_mem == 0) && (-1 < pPVar5->iState)) {
    if (pPVar5->iLock != 0) {
      (*pPVar5->pfd->pMethods->xUnlock)(pPVar5->pfd,0);
      pPVar5->iLock = 0;
    }
    pChunk = pPVar5->pfd;
    if (pChunk != (unqlite_file *)0x0) {
      pBackend = pPVar5->pAllocator;
      (*pChunk->pMethods->xClose)(pChunk);
      SyMemBackendFree(pBackend,pChunk);
    }
  }
  if (pPVar5->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPVar5->pVec);
    pPVar5->pVec = (Bitvec *)0x0;
  }
  if (0 < pDb->iVm) {
    puVar6 = pDb->pVms;
    do {
      puVar2 = puVar6->pNext;
      jx9_vm_release(puVar6->pJx9Vm);
      SyMemBackendRelease(&puVar6->sAlloc);
      iVar1 = pDb->iVm;
      pDb->iVm = iVar1 + -1;
      puVar6 = puVar2;
    } while (1 < iVar1);
  }
  pEngine = (pDb->sDB).pJx9;
  if ((pEngine != (jx9 *)0x0) && (pEngine->nMagic == 0xf874bcd7)) {
    EngineRelease(pEngine);
    if (sJx9MPGlobal.pEngines == pEngine) {
      sJx9MPGlobal.pEngines = (sJx9MPGlobal.pEngines)->pNext;
    }
    pjVar3 = pEngine->pPrev;
    if (pjVar3 != (jx9 *)0x0) {
      pjVar3->pNext = pEngine->pNext;
    }
    if (pEngine->pNext != (jx9 *)0x0) {
      pEngine->pNext->pPrev = pjVar3;
    }
    sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + -1;
    SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pEngine);
  }
  pDb->nMagic = 0x7250;
  SyMemBackendRelease(&pDb->sMem);
  return iVar4;
}

Assistant:

static int unqliteDbRelease(unqlite *pDb)
{
	unqlite_db *pStore = &pDb->sDB;
	unqlite_vm *pVm,*pNext;
	int rc = UNQLITE_OK;
	if( (pDb->iFlags & UNQLITE_FL_DISABLE_AUTO_COMMIT) == 0 ){
		/* Commit any outstanding transaction */
		rc = unqlitePagerCommit(pStore->pPager);
		if( rc != UNQLITE_OK ){
			/* Rollback the transaction */
			rc = unqlitePagerRollback(pStore->pPager,FALSE);
		}
	}else{
		/* Rollback any outstanding transaction */
		rc = unqlitePagerRollback(pStore->pPager,FALSE);
	}
	/* Close the pager */
	unqlitePagerClose(pStore->pPager);
	/* Release any active VM's */
	pVm = pDb->pVms;
	for(;;){
		if( pDb->iVm < 1 ){
			break;
		}
		/* Point to the next entry */
		pNext = pVm->pNext;
		unqliteVmRelease(pVm);
		pVm = pNext;
		pDb->iVm--;
	}
	/* Release the Jx9 handle */
	jx9_release(pStore->pJx9);
	/* Set a dummy magic number */
	pDb->nMagic = 0x7250;
	/* Release the whole memory subsystem */
	SyMemBackendRelease(&pDb->sMem);
	/* Commit or rollback result */
	return rc;
}